

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

int indexof(ctmbstr item,ctmbstr *list)

{
  int iVar1;
  uint local_24;
  uint i;
  ctmbstr *list_local;
  ctmbstr item_local;
  
  if (list != (ctmbstr *)0x0) {
    for (local_24 = 0; list[local_24] != (ctmbstr)0x0; local_24 = local_24 + 1) {
      iVar1 = prvTidytmbstrcasecmp(item,list[local_24]);
      if (iVar1 == 0) {
        return local_24;
      }
    }
  }
  return -1;
}

Assistant:

static
int indexof( ctmbstr item, ctmbstr *list )
{
    if ( list )
    {
        uint i = 0;
        while ( list[i] != NULL ) {
            if ( TY_(tmbstrcasecmp)(item, list[i]) == 0 )
                return i;
            i++;
        }
    }

    return -1;
}